

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O0

void COST_SENSITIVE::parse_label(parser *p,shared_data *sd,void *v,v_array<substring> *words)

{
  substring ss;
  substring ss_00;
  substring ss_01;
  substring ss_02;
  substring s;
  bool bVar1;
  size_t sVar2;
  substring *psVar3;
  ostream *poVar4;
  substring *psVar5;
  vw_exception *this;
  uint64_t uVar6;
  string *pmessage;
  undefined8 uVar7;
  v_array<substring> *in_RCX;
  long in_RSI;
  long in_RDI;
  stringstream __msg_1;
  stringstream __msg;
  wclass f_2;
  uint i;
  wclass f_1;
  wclass f;
  bool eq_label;
  bool eq_shared;
  float fx;
  label *ld;
  wclass *in_stack_fffffffffffffb58;
  v_array<COST_SENSITIVE::wclass> *in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb68;
  char *in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffb78;
  namedlabels *in_stack_fffffffffffffb80;
  int iVar8;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  vw_exception *in_stack_fffffffffffffb90;
  substring *in_stack_fffffffffffffba8;
  ostream *in_stack_fffffffffffffbb0;
  substring in_stack_fffffffffffffbc8;
  stringstream local_418 [16];
  ostream local_408;
  float *in_stack_fffffffffffffd50;
  v_array<substring> *in_stack_fffffffffffffd58;
  substring *in_stack_fffffffffffffd60;
  stringstream local_248 [16];
  ostream local_238;
  float local_bc;
  undefined4 local_b8;
  uint local_ac;
  char *local_a8;
  char *local_a0;
  float local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined8 local_88;
  undefined8 local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  bool local_41;
  char *local_40;
  char *local_38;
  byte local_2d;
  v_array<substring> *local_20;
  long local_10;
  long local_8;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  v_array<COST_SENSITIVE::wclass>::clear(in_stack_fffffffffffffb60);
  sVar2 = v_array<substring>::size(local_20);
  if (sVar2 == 1) {
    v_array<substring>::operator[](local_20,0);
    name_value(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    psVar3 = v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x318),0);
    local_40 = psVar3->begin;
    local_38 = psVar3->end;
    ss.end = (char *)in_stack_fffffffffffffb78;
    ss.begin = in_stack_fffffffffffffb70;
    local_2d = substring_eq(ss,in_stack_fffffffffffffb68);
    psVar3 = v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x318),0);
    local_58 = psVar3->begin;
    local_50 = psVar3->end;
    ss_00.end = (char *)in_stack_fffffffffffffb78;
    ss_00.begin = in_stack_fffffffffffffb70;
    local_41 = substring_eq(ss_00,in_stack_fffffffffffffb68);
    if (*(long *)(local_10 + 0x70) == 0) {
      psVar3 = v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x318),0);
      local_68 = psVar3->begin;
      local_60 = psVar3->end;
      ss_01.end = (char *)in_stack_fffffffffffffb78;
      ss_01.begin = in_stack_fffffffffffffb70;
      bVar1 = substring_eq(ss_01,in_stack_fffffffffffffb68);
      local_2d = (local_2d & 1) != 0 || bVar1;
      psVar3 = v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x318),0);
      local_78 = psVar3->begin;
      local_70 = psVar3->end;
      ss_02.end = (char *)in_stack_fffffffffffffb78;
      ss_02.begin = in_stack_fffffffffffffb70;
      bVar1 = substring_eq(ss_02,in_stack_fffffffffffffb68);
      local_41 = (local_41 & 1U) != 0 || bVar1;
    }
    if (((local_2d & 1) != 0) || (local_41 != false)) {
      if ((local_2d & 1) != 0) {
        sVar2 = v_array<substring>::size((v_array<substring> *)(local_8 + 0x318));
        if (sVar2 == 1) {
          local_88 = 0xff7fffff;
          local_80 = 0;
          v_array<COST_SENSITIVE::wclass>::push_back
                    (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
        }
        else {
          std::operator<<((ostream *)&std::cerr,"shared feature vectors should not have costs on: ")
          ;
          v_array<substring>::operator[](local_20,0);
          poVar4 = ::operator<<(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
      }
      if ((local_41 & 1U) == 0) {
        return;
      }
      sVar2 = v_array<substring>::size((v_array<substring> *)(local_8 + 0x318));
      if (sVar2 != 2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "label feature vectors should have exactly one cost on: ");
        v_array<substring>::operator[](local_20,0);
        poVar4 = ::operator<<(poVar4,in_stack_fffffffffffffba8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        return;
      }
      psVar3 = v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x318),1);
      local_a8 = psVar3->begin;
      local_a0 = psVar3->end;
      local_98 = float_of_substring(in_stack_fffffffffffffbc8);
      local_94 = 0;
      local_90 = 0;
      local_8c = 0;
      v_array<COST_SENSITIVE::wclass>::push_back
                (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      return;
    }
  }
  local_ac = 0;
  while( true ) {
    psVar3 = (substring *)(ulong)local_ac;
    psVar5 = (substring *)v_array<substring>::size(local_20);
    if (psVar5 <= psVar3) {
      return;
    }
    memset(&local_bc,0,0x10);
    v_array<substring>::operator[](local_20,(ulong)local_ac);
    name_value(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    sVar2 = v_array<substring>::size((v_array<substring> *)(local_8 + 0x318));
    iVar8 = (int)((ulong)in_stack_fffffffffffffb80 >> 0x20);
    if (sVar2 == 0) break;
    sVar2 = v_array<substring>::size((v_array<substring> *)(local_8 + 0x318));
    if ((sVar2 != 1) &&
       (sVar2 = v_array<substring>::size((v_array<substring> *)(local_8 + 0x318)), sVar2 != 2)) {
      sVar2 = v_array<substring>::size((v_array<substring> *)(local_8 + 0x318));
      iVar8 = (int)((ulong)in_stack_fffffffffffffb80 >> 0x20);
      if (sVar2 != 3) {
        std::__cxx11::stringstream::stringstream(local_418);
        pmessage = (string *)std::operator<<(&local_408,"malformed cost specification on \'");
        psVar3 = v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x318),0);
        poVar4 = std::operator<<((ostream *)pmessage,psVar3->begin);
        std::operator<<(poVar4,"\'");
        uVar7 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_fffffffffffffb90,
                   (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),iVar8,
                   pmessage);
        __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    if (*(long *)(local_10 + 0x70) == 0) {
      v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x318),0);
      s.end = (char *)in_stack_fffffffffffffb78;
      s.begin = in_stack_fffffffffffffb70;
      uVar6 = hashstring(s,(uint64_t)in_stack_fffffffffffffb68);
      in_stack_fffffffffffffb8c = (undefined4)uVar6;
    }
    else {
      in_stack_fffffffffffffb80 = *(namedlabels **)(local_10 + 0x70);
      v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x318),0);
      uVar6 = namedlabels::get(in_stack_fffffffffffffb80,(substring *)in_stack_fffffffffffffb78);
      in_stack_fffffffffffffb8c = (undefined4)uVar6;
    }
    local_b8 = in_stack_fffffffffffffb8c;
    sVar2 = v_array<substring>::size((v_array<substring> *)(local_8 + 0x318));
    if ((sVar2 == 1) && (0.0 <= local_bc)) {
      local_bc = 3.4028235e+38;
    }
    v_array<COST_SENSITIVE::wclass>::push_back(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    local_ac = local_ac + 1;
  }
  std::__cxx11::stringstream::stringstream(local_248);
  std::operator<<(&local_238," invalid cost: specification -- no names on: ");
  v_array<substring>::operator[](local_20,(ulong)local_ac);
  ::operator<<(in_stack_fffffffffffffbb0,psVar3);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            (this,(char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),iVar8,
             in_stack_fffffffffffffb78);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void parse_label(parser* p, shared_data* sd, void* v, v_array<substring>& words)
{
  label* ld = (label*)v;
  ld->costs.clear();

  // handle shared and label first
  if (words.size() == 1)
  {
    float fx;
    name_value(words[0], p->parse_name, fx);
    bool eq_shared = substring_eq(p->parse_name[0], "***shared***");
    bool eq_label = substring_eq(p->parse_name[0], "***label***");
    if (!sd->ldict)
    {
      eq_shared |= substring_eq(p->parse_name[0], "shared");
      eq_label |= substring_eq(p->parse_name[0], "label");
    }
    if (eq_shared || eq_label)
    {
      if (eq_shared)
      {
        if (p->parse_name.size() != 1)
          cerr << "shared feature vectors should not have costs on: " << words[0] << endl;
        else
        {
          wclass f = {-FLT_MAX, 0, 0., 0.};
          ld->costs.push_back(f);
        }
      }
      if (eq_label)
      {
        if (p->parse_name.size() != 2)
          cerr << "label feature vectors should have exactly one cost on: " << words[0] << endl;
        else
        {
          wclass f = {float_of_substring(p->parse_name[1]), 0, 0., 0.};
          ld->costs.push_back(f);
        }
      }
      return;
    }
  }

  // otherwise this is a "real" example
  for (unsigned int i = 0; i < words.size(); i++)
  {
    wclass f = {0., 0, 0., 0.};
    name_value(words[i], p->parse_name, f.x);

    if (p->parse_name.size() == 0)
      THROW(" invalid cost: specification -- no names on: " << words[i]);

    if (p->parse_name.size() == 1 || p->parse_name.size() == 2 || p->parse_name.size() == 3)
    {
      f.class_index =
          sd->ldict ? (uint32_t)sd->ldict->get(p->parse_name[0]) : (uint32_t)hashstring(p->parse_name[0], 0);
      if (p->parse_name.size() == 1 && f.x >= 0)  // test examples are specified just by un-valued class #s
        f.x = FLT_MAX;
    }
    else
      THROW("malformed cost specification on '" << (p->parse_name[0].begin) << "'");

    ld->costs.push_back(f);
  }
}